

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler.cpp
# Opt level: O2

int __thiscall
LockstepScheduler::cond_timedwait
          (LockstepScheduler *this,pthread_cond_t *cond,pthread_mutex_t *lock,uint64_t time_us)

{
  mutex *__mutex;
  ulong uVar1;
  element_type *peVar2;
  int iVar3;
  int *piVar4;
  lock_guard<std::mutex> lock_timed_waits;
  shared_ptr<LockstepScheduler::TimedWait> new_timed_wait;
  __shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  new_timed_wait.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  new_timed_wait.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __mutex = &this->timed_waits_mutex_;
  std::mutex::lock(__mutex);
  uVar1 = (this->time_us_).super___atomic_base<unsigned_long>._M_i;
  if (uVar1 < time_us) {
    std::make_shared<LockstepScheduler::TimedWait>();
    std::__shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&new_timed_wait.
                super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>,
               &local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    (new_timed_wait.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->time_us = time_us;
    (new_timed_wait.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->passed_cond = cond;
    (new_timed_wait.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->passed_lock = lock;
    std::
    vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
    ::push_back(&this->timed_waits_,
                (value_type *)
                &new_timed_wait.
                 super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>);
    this->timed_waits_iterator_invalidated_ = true;
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = 0x6e;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (uVar1 < time_us) {
    iVar3 = pthread_cond_wait((pthread_cond_t *)cond,(pthread_mutex_t *)lock);
    pthread_mutex_unlock((pthread_mutex_t *)lock);
    std::mutex::lock(__mutex);
    peVar2 = new_timed_wait.
             super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((iVar3 == 0) &&
       (iVar3 = 0,
       (new_timed_wait.super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->timeout == true)) {
      piVar4 = __errno_location();
      *piVar4 = 0x6e;
      iVar3 = -1;
    }
    peVar2->done = true;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    pthread_mutex_lock((pthread_mutex_t *)lock);
  }
  else {
    iVar3 = -1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&new_timed_wait.
              super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return iVar3;
}

Assistant:

int LockstepScheduler::cond_timedwait(pthread_cond_t *cond, pthread_mutex_t *lock, uint64_t time_us)
{
    std::shared_ptr<TimedWait> new_timed_wait;
    {
        std::lock_guard<std::mutex> lock_timed_waits(timed_waits_mutex_);

        // The time has already passed.
        if (time_us <= time_us_) {
            errno = ETIMEDOUT;
            return -1;
        }

        new_timed_wait = std::make_shared<TimedWait>();
        new_timed_wait->time_us = time_us;
        new_timed_wait->passed_cond = cond;
        new_timed_wait->passed_lock = lock;
        timed_waits_.push_back(new_timed_wait);
        timed_waits_iterator_invalidated_ = true;
    }

    while (true) {
        int result = pthread_cond_wait(cond, lock);

        // We need to unlock before aqcuiring the timed_waits_mutex, otherwise
        // we are at rist of priority inversion.
        pthread_mutex_unlock(lock);

        {
            std::lock_guard<std::mutex> lock_timed_waits(timed_waits_mutex_);

            if (result == 0 && new_timed_wait->timeout) {
                errno = ETIMEDOUT;
                result = -1;
            }

            new_timed_wait->done = true;
        }

        // The lock needs to be locked on exit of this function
        pthread_mutex_lock(lock);
        return result;
    }
}